

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media-adv.c
# Opt level: O0

void la_media_adv_format_text(la_vstring *vstr,void *data,int indent)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  uint in_EDX;
  byte *in_RSI;
  la_vstring *in_RDI;
  char *pcVar4;
  char *link;
  size_t i;
  size_t count;
  la_media_adv_msg *msg;
  ulong local_30;
  
  if ((*in_RSI & 1) == 1) {
    la_vstring_append_sprintf(in_RDI,"%*s-- Unparseable Media Advisory message\n",(ulong)in_EDX,"");
  }
  else {
    la_vstring_append_sprintf
              (in_RDI,"%*sMedia Advisory, version %d:\n",(ulong)in_EDX,"",(ulong)in_RSI[1]);
    uVar1 = in_EDX + 1;
    pcVar2 = get_link_description(in_RSI[6]);
    pcVar4 = "lost";
    if (in_RSI[5] == 0x45) {
      pcVar4 = "established";
    }
    la_vstring_append_sprintf
              (in_RDI,"%*sLink %s %s at %02d:%02d:%02d UTC\n",(ulong)uVar1,"",pcVar2,pcVar4,
               (uint)in_RSI[2],(uint)in_RSI[3],(uint)in_RSI[4]);
    la_vstring_append_sprintf(in_RDI,"%*sAvailable links: ",(ulong)uVar1,"");
    sVar3 = strlen((char *)**(undefined8 **)(in_RSI + 8));
    for (local_30 = 0; local_30 < sVar3; local_30 = local_30 + 1) {
      pcVar2 = get_link_description(*(char *)(**(long **)(in_RSI + 8) + local_30));
      if (local_30 == sVar3 - 1) {
        la_vstring_append_sprintf(in_RDI,"%s\n",pcVar2);
      }
      else {
        la_vstring_append_sprintf(in_RDI,"%s, ",pcVar2);
      }
    }
    if ((*(long *)(in_RSI + 0x10) != 0) && (**(char **)(in_RSI + 0x10) != '\0')) {
      la_vstring_append_sprintf
                (in_RDI,"%*sText: %s\n",(ulong)uVar1,"",*(undefined8 *)(in_RSI + 0x10));
    }
  }
  return;
}

Assistant:

void la_media_adv_format_text(la_vstring *vstr, void const *data, int indent) {
	la_assert(vstr);
	la_assert(data);
	la_assert(indent >= 0);

	la_media_adv_msg const *msg = data;

	if(msg->err == true) {
		LA_ISPRINTF(vstr, indent, "-- Unparseable Media Advisory message\n");
		return;
	}

	LA_ISPRINTF(vstr, indent, "Media Advisory, version %d:\n", msg->version);
	indent++;

	LA_ISPRINTF(vstr, indent, "Link %s %s at %02d:%02d:%02d UTC\n",
			get_link_description(msg->current_link),
			(msg->state == 'E') ? "established" : "lost",
			msg->hour, msg->minute, msg->second
			);

	LA_ISPRINTF(vstr, indent, "Available links: ");
	size_t count = strlen(msg->available_links->str);
	for(size_t i = 0; i < count; i++) {
		char const *link = get_link_description(msg->available_links->str[i]);
		if(i == count - 1) {
			la_vstring_append_sprintf(vstr, "%s\n", link);
		} else {
			la_vstring_append_sprintf(vstr, "%s, ", link);
		}
	}

	if(msg->text != NULL && msg->text[0] != '\0') {
		LA_ISPRINTF(vstr, indent, "Text: %s\n", msg->text);
	}
}